

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O0

exr_result_t
exr_compress_buffer(exr_const_context_t_conflict ctxt,int level,void *in,size_t in_bytes,void *out,
                   size_t out_bytes_avail,size_t *actual_out)

{
  long lVar1;
  long lVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long *in_stack_00000008;
  size_t outsz;
  libdeflate_compressor *comp;
  code *local_60;
  code *local_50;
  int local_14 [4];
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_50 = internal_exr_alloc;
    local_60 = internal_exr_free;
  }
  else {
    local_50 = *(code **)(in_RDI + 0x58);
    local_60 = *(code **)(in_RDI + 0x60);
  }
  local_14[0] = in_ESI;
  libdeflate_set_memory_allocator(local_50,local_60);
  if ((local_14[0] < 0) && (exr_get_default_zip_compression_level(local_14), local_14[0] < 0)) {
    local_14[0] = 4;
  }
  lVar1 = libdeflate_alloc_compressor(local_14[0]);
  if (lVar1 == 0) {
    local_4 = 1;
  }
  else {
    lVar2 = libdeflate_zlib_compress(lVar1,in_RDX,in_RCX,in_R8,in_R9);
    libdeflate_free_compressor(lVar1);
    if (lVar2 == 0) {
      local_4 = 1;
    }
    else {
      if (in_stack_00000008 != (long *)0x0) {
        *in_stack_00000008 = lVar2;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_compress_buffer (
    exr_const_context_t ctxt,
    int                 level,
    const void*         in,
    size_t              in_bytes,
    void*               out,
    size_t              out_bytes_avail,
    size_t*             actual_out)
{
    struct libdeflate_compressor* comp;

#ifdef EXR_USE_CONFIG_DEFLATE_STRUCT
    struct libdeflate_options opt = {
        .sizeof_options = sizeof (struct libdeflate_options),
        .malloc_func    = ctxt ? ctxt->alloc_fn : internal_exr_alloc,
        .free_func      = ctxt ? ctxt->free_fn : internal_exr_free};

#else
    libdeflate_set_memory_allocator (
        ctxt ? ctxt->alloc_fn : internal_exr_alloc,
        ctxt ? ctxt->free_fn : internal_exr_free);
#endif

    if (level < 0)
    {
        exr_get_default_zip_compression_level (&level);
        /* truly unset anywhere */
        if (level < 0) level = EXR_DEFAULT_ZLIB_COMPRESS_LEVEL;
    }

#ifdef EXR_USE_CONFIG_DEFLATE_STRUCT
    comp = libdeflate_alloc_compressor_ex (level, &opt);
#else
    comp = libdeflate_alloc_compressor (level);
#endif
    if (comp)
    {
        size_t outsz;
        outsz =
            libdeflate_zlib_compress (comp, in, in_bytes, out, out_bytes_avail);

        libdeflate_free_compressor (comp);

        if (outsz != 0)
        {
            if (actual_out) *actual_out = outsz;
            return EXR_ERR_SUCCESS;
        }
        return EXR_ERR_OUT_OF_MEMORY;
    }
    return EXR_ERR_OUT_OF_MEMORY;
}